

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen-x86_64.c
# Opt level: O0

int find_insn_pattern(gen_ctx_t gen_ctx,MIR_insn_t insn,int *size)

{
  int iVar1;
  int iVar2;
  insn_pattern_info_t iVar3;
  int local_40;
  int iStack_3c;
  insn_pattern_info_t info;
  pattern *pat;
  int ind;
  int i;
  int *size_local;
  MIR_insn_t insn_local;
  gen_ctx_t gen_ctx_local;
  
  iVar3 = VARR_insn_pattern_info_tget
                    (gen_ctx->target_ctx->insn_pattern_info,*(ulong *)&insn->field_0x18 & 0xffffffff
                    );
  pat._4_4_ = 0;
  while( true ) {
    iStack_3c = iVar3.num;
    if (iStack_3c <= pat._4_4_) {
      return -1;
    }
    local_40 = iVar3.start;
    iVar1 = VARR_intget(gen_ctx->target_ctx->pattern_indexes,(long)(local_40 + pat._4_4_));
    iVar2 = pattern_match_p(gen_ctx,patterns + iVar1,insn,(uint)(size == (int *)0x0));
    if (iVar2 != 0) break;
    pat._4_4_ = pat._4_4_ + 1;
  }
  if (size == (int *)0x0) {
    return iVar1;
  }
  *size = patterns[iVar1].max_insn_size;
  return iVar1;
}

Assistant:

static int find_insn_pattern (gen_ctx_t gen_ctx, MIR_insn_t insn, int *size) {
  int i, ind;
  const struct pattern *pat;
  insn_pattern_info_t info = VARR_GET (insn_pattern_info_t, insn_pattern_info, insn->code);

  for (i = 0; i < info.num; i++) {
    ind = VARR_GET (int, pattern_indexes, info.start + i);
    pat = &patterns[ind];
    if (pattern_match_p (gen_ctx, pat, insn, size == NULL)) {
      if (size != NULL) *size = patterns[ind].max_insn_size;
      return ind;
    }
  }
  return -1;
}